

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSInputImpl.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DOMLSInputImpl::setEncoding(DOMLSInputImpl *this,XMLCh *encodingStr)

{
  XMLCh *pXVar1;
  
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fEncoding);
  pXVar1 = XMLString::replicate(encodingStr,this->fMemoryManager);
  this->fEncoding = pXVar1;
  return;
}

Assistant:

void DOMLSInputImpl::setEncoding(const XMLCh* const encodingStr)
{
    fMemoryManager->deallocate(fEncoding);
    fEncoding = XMLString::replicate(encodingStr, fMemoryManager);
}